

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O2

bool __thiscall OpenMesh::IO::_OFFReader_::can_u_read(_OFFReader_ *this,istream *_is)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  char local_1028 [8];
  char line [4096];
  
  (this->options_).flags_ = 0;
  pcVar6 = local_1028;
  std::istream::getline((char *)_is,(long)pcVar6);
  lVar3 = *(long *)(_is + 8);
  if (((1 < lVar3) && (local_1028[0] == 'S')) && (local_1028[1] == 'T')) {
    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x40;
    pcVar6 = local_1028 + 2;
    lVar3 = lVar3 + -2;
  }
  if (0 < lVar3) {
    cVar7 = *pcVar6;
    if (cVar7 == 'C') {
      (this->options_).flags_ = (this->options_).flags_ | 0x220;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return false;
      }
      cVar7 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    }
    if (cVar7 == 'N') {
      *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x10;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return false;
      }
      cVar7 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    }
    cVar5 = cVar7;
    if (cVar7 == '4') {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return false;
      }
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      cVar5 = *pcVar1;
    }
    uVar4 = lVar3 - (ulong)(cVar5 == 'n');
    if (((2 < uVar4) && (pcVar6 = pcVar6 + (cVar5 == 'n'), *pcVar6 == 'O')) &&
       ((pcVar6[1] == 'F' && (pcVar6[2] == 'F')))) {
      if ((9 < uVar4) && (iVar2 = strncmp(pcVar6 + 4,"BINARY",6), iVar2 == 0)) {
        *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 1;
      }
      return cVar7 != '4' && cVar5 != 'n';
    }
  }
  return false;
}

Assistant:

bool _OFFReader_::can_u_read(std::istream& _is) const
{
  options_.cleanup();

  // read 1st line
  char line[LINE_LEN], *p;
  _is.getline(line, LINE_LEN);
  p = line;

  std::streamsize remainingChars = _is.gcount();

  bool vertexDimensionTooHigh = false;

  // check header: [ST][C][N][4][n]OFF BINARY

  if ( ( remainingChars > 1 ) && ( p[0] == 'S' && p[1] == 'T') )
  { options_ += Options::VertexTexCoord; p += 2; remainingChars -= 2; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'C') )
  { options_ += Options::VertexColor;
    options_ += Options::FaceColor; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'N') )
  { options_ += Options::VertexNormal; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && (p[0] == '4' ) )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'n') )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars < 3 ) || (!(p[0] == 'O' && p[1] == 'F' && p[2] == 'F')  ) )
    return false;

  p += 4;

  // Detect possible garbage and make sure, we don't have an underflow
  if ( remainingChars >= 4 )
    remainingChars -= 4;
  else
    remainingChars = 0;

  if ( ( remainingChars >= 6 ) && ( strncmp(p, "BINARY", 6) == 0 ) )
    options_+= Options::Binary;

  // vertex Dimensions != 3 are currently not supported
  if (vertexDimensionTooHigh)
    return false;

  return true;
}